

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

void separate_version(char *name,char *ver,int checkp)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char ver_buf [16];
  char local_48 [24];
  
  pcVar8 = local_48;
  pcVar4 = strchr(name,0x7e);
  pcVar2 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    do {
      pcVar5 = pcVar2;
      lVar6 = 0;
      do {
        lVar1 = lVar6 + 1;
        lVar6 = lVar6 + 1;
        if (pcVar5[lVar1] == '\0') {
          if ((pcVar4 == pcVar5) || (lVar6 != 1 || pcVar4[-1] != '.')) goto LAB_00120828;
          strncpy(local_48,pcVar4 + 1,(size_t)(pcVar5 + ~(ulong)pcVar4));
          local_48[(long)(pcVar5 + ~(ulong)pcVar4)] = '\0';
          if (checkp == 0) {
            pcVar4[-1] = '\0';
            goto LAB_00120846;
          }
          iVar3 = 6;
          if (local_48[0] == '\0') goto LAB_001207cd;
          goto joined_r0x001207b0;
        }
      } while (pcVar5[lVar1] != '~');
      pcVar2 = pcVar5 + lVar6;
      pcVar4 = pcVar5;
    } while( true );
  }
  pcVar8 = strchr(name,0x25);
  if (pcVar8 != (char *)0x0) {
    ver[0] = '0';
    ver[1] = '\0';
    return;
  }
  goto LAB_00120828;
joined_r0x001207b0:
  if (local_48[0] == '\0') goto LAB_001207c8;
  pcVar8 = pcVar8 + 1;
  if ((byte)(local_48[0] - 0x3aU) < 0xf6) goto LAB_001207cd;
  local_48[0] = *pcVar8;
  goto joined_r0x001207b0;
LAB_001207c8:
  iVar3 = 10;
LAB_001207cd:
  if (iVar3 != 6) {
    if (iVar3 != 10) {
      return;
    }
    pcVar4[-1] = '\0';
    *pcVar5 = '\0';
    uVar7 = strtoul(pcVar4 + 1,(char **)0x0,10);
    sprintf(local_48,"%u",uVar7 & 0xffffffff);
LAB_00120846:
    strcpy(ver,local_48);
    return;
  }
LAB_00120828:
  *ver = '\0';
  return;
}

Assistant:

void separate_version(char *name, char *ver, int checkp)
{
  char *start, *end, *cp;
  unsigned ver_no;
  size_t len;
  char ver_buf[VERSIONLEN];

  if ((end = (char *)strchr(name, '~')) != (char *)NULL) {
    start = end;
    cp = end + 1;
    while (*cp) {
      if (*cp == '~') {
        start = end;
        end = cp;
      }
      cp++;
    }

    if (start != end && *(start - 1) == '.' && end == (cp - 1)) {
      /*
       * name ends in the form ".~###~". But we have to check
       * ### are all numbers or not, if checkp is 1.
       */
      len = (end - start) - 1;
      strncpy(ver_buf, start + 1, len);
      ver_buf[len] = '\0';
      if (checkp) {
        NumericStringP(ver_buf, YES, NO);
      YES:
        /*
         * name contains a valid version field.
         */
        *(start - 1) = '\0';
        *end = '\0';
        /*
         * Use strtoul() to eliminate leading 0s.
         */
        ver_no = strtoul(start + 1, (char **)NULL, 10);
        sprintf(ver_buf, "%u", ver_no);
        strcpy(ver, ver_buf);
        return;
      } else {
        *(start - 1) = '\0';
        strcpy(ver, ver_buf);
        return;
      }
    }
  } else if (strchr(name, '%')) {
    strcpy(ver, "0");
    return;
  }
NO:
  /* name does not contain a valid version field. */
  *ver = '\0';
}